

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastrender.h
# Opt level: O3

void __thiscall SQCompilation::RenderVisitor::visitClassDecl(RenderVisitor *this,ClassDecl *cls)

{
  OutputStream::writeString(this->_out,"CLASS ");
  if (&cls->_key->super_Node != (Node *)0x0) {
    Node::visit<SQCompilation::RenderVisitor>(&cls->_key->super_Node,this);
  }
  if (cls->_base != (Expr *)0x0) {
    OutputStream::writeString(this->_out,"EXTENDS ");
    if ((cls->_base->super_Node)._op == TO_DECL_EXPR) {
      OutputStream::writeChar(this->_out,'(');
      Node::visit<SQCompilation::RenderVisitor>(&cls->_base->super_Node,this);
      OutputStream::writeChar(this->_out,')');
    }
    else {
      Node::visit<SQCompilation::RenderVisitor>(&cls->_base->super_Node,this);
    }
    OutputStream::writeChar(this->_out,' ');
  }
  (*(this->super_Visitor)._vptr_Visitor[0x2d])(this,cls);
  return;
}

Assistant:

virtual void visitClassDecl(ClassDecl *cls) {
        _out->writeString("CLASS ");
        if (cls->classKey()) cls->classKey()->visit(this);
        if (cls->classBase()) {
            _out->writeString("EXTENDS ");
            bool addParens = cls->classBase()->op() == TO_DECL_EXPR;
            if (addParens)
              _out->writeChar('(');
            cls->classBase()->visit(this);
            if (addParens)
              _out->writeChar(')');
            _out->writeChar(' ');
        }
        visitTableDecl(cls);
    }